

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

void LZ4HC_setExternalDict(LZ4HC_CCtx_internal *ctxPtr,BYTE *newBlock)

{
  LZ4_byte *pLVar1;
  uint uVar2;
  U32 UVar3;
  BYTE *newBlock_local;
  LZ4HC_CCtx_internal *ctxPtr_local;
  size_t delta;
  uint local_38;
  U32 h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 *hashTable;
  U16 *chainTable;
  
  if (ctxPtr->base + (ulong)ctxPtr->dictLimit + 4 <= ctxPtr->end) {
    pLVar1 = ctxPtr->base;
    uVar2 = ((int)ctxPtr->end + -3) - (int)pLVar1;
    for (local_38 = ctxPtr->nextToUpdate; local_38 < uVar2; local_38 = local_38 + 1) {
      UVar3 = LZ4HC_hashPtr(pLVar1 + local_38);
      ctxPtr_local = (LZ4HC_CCtx_internal *)(ulong)(local_38 - ctxPtr->hashTable[UVar3]);
      if ((LZ4HC_CCtx_internal *)0xffff < ctxPtr_local) {
        ctxPtr_local = (LZ4HC_CCtx_internal *)0xffff;
      }
      ctxPtr->chainTable[local_38 & 0xffff] = (LZ4_u16)ctxPtr_local;
      ctxPtr->hashTable[UVar3] = local_38;
    }
    ctxPtr->nextToUpdate = uVar2;
  }
  ctxPtr->lowLimit = ctxPtr->dictLimit;
  ctxPtr->dictLimit = (int)ctxPtr->end - (int)ctxPtr->base;
  ctxPtr->dictBase = ctxPtr->base;
  ctxPtr->base = newBlock + -(ulong)ctxPtr->dictLimit;
  ctxPtr->end = newBlock;
  ctxPtr->nextToUpdate = ctxPtr->dictLimit;
  ctxPtr->dictCtx = (LZ4HC_CCtx_internal *)0x0;
  return;
}

Assistant:

static void LZ4HC_setExternalDict(LZ4HC_CCtx_internal* ctxPtr, const BYTE* newBlock)
{
    DEBUGLOG(4, "LZ4HC_setExternalDict(%p, %p)", ctxPtr, newBlock);
    if (ctxPtr->end >= ctxPtr->base + ctxPtr->dictLimit + 4)
        LZ4HC_Insert (ctxPtr, ctxPtr->end-3);   /* Referencing remaining dictionary content */

    /* Only one memory segment for extDict, so any previous extDict is lost at this stage */
    ctxPtr->lowLimit  = ctxPtr->dictLimit;
    ctxPtr->dictLimit = (U32)(ctxPtr->end - ctxPtr->base);
    ctxPtr->dictBase  = ctxPtr->base;
    ctxPtr->base = newBlock - ctxPtr->dictLimit;
    ctxPtr->end  = newBlock;
    ctxPtr->nextToUpdate = ctxPtr->dictLimit;   /* match referencing will resume from there */

    /* cannot reference an extDict and a dictCtx at the same time */
    ctxPtr->dictCtx = NULL;
}